

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)7,QRgba64>
               (QRgba64 *buf1,QRgba64 *buf2,int len,QTextureData *image,int fx,int fy,int fdx,
               int fdy)

{
  uchar *puVar1;
  uchar *puVar2;
  QTextureData *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  uchar *s2_1;
  uchar *s1_1;
  int i_1;
  int i;
  uchar *s2;
  uchar *s1;
  Fetch1PixelFunc fetch1;
  bool useFetch;
  QPixelLayout *layout;
  int y2_1;
  int y1_1;
  int x2_1;
  int x1_1;
  int x2;
  int x1;
  int y2;
  int y1;
  int local_80;
  int local_7c;
  int local_50;
  int local_4c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = in_R8D;
  if ((int)s1_1 == 0) {
    local_c = in_R9D >> 0x10;
    local_10 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
              (in_RCX->height,in_RCX->y1,in_RCX->y2 + -1,&local_c,&local_10);
    puVar1 = QTextureData::scanLine(in_RCX,local_c);
    puVar2 = QTextureData::scanLine(in_RCX,local_10);
    for (local_7c = 0; local_7c < in_EDX; local_7c = local_7c + 1) {
      local_14 = local_4c >> 0x10;
      local_18 = -0x55555556;
      fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
                (in_RCX->width,in_RCX->x1,in_RCX->x2 + -1,&local_14,&local_18);
      *(undefined8 *)(in_RDI + (long)(local_7c << 1) * 8) =
           *(undefined8 *)(puVar1 + (long)local_14 * 8);
      *(undefined8 *)(in_RDI + (long)(local_7c * 2 + 1) * 8) =
           *(undefined8 *)(puVar1 + (long)local_18 * 8);
      *(undefined8 *)(in_RSI + (long)(local_7c << 1) * 8) =
           *(undefined8 *)(puVar2 + (long)local_14 * 8);
      *(undefined8 *)(in_RSI + (long)(local_7c * 2 + 1) * 8) =
           *(undefined8 *)(puVar2 + (long)local_18 * 8);
      local_4c = (int)s2_1 + local_4c;
    }
  }
  else {
    local_50 = in_R9D;
    for (local_80 = 0; local_80 < in_EDX; local_80 = local_80 + 1) {
      local_1c = local_4c >> 0x10;
      local_20 = -0x55555556;
      local_24 = local_50 >> 0x10;
      local_28 = -0x55555556;
      fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
                (in_RCX->width,in_RCX->x1,in_RCX->x2 + -1,&local_1c,&local_20);
      fetchTransformedBilinear_pixelBounds<(TextureBlendType)5>
                (in_RCX->height,in_RCX->y1,in_RCX->y2 + -1,&local_24,&local_28);
      puVar1 = QTextureData::scanLine(in_RCX,local_24);
      puVar2 = QTextureData::scanLine(in_RCX,local_28);
      *(undefined8 *)(in_RDI + (long)(local_80 << 1) * 8) =
           *(undefined8 *)(puVar1 + (long)local_1c * 8);
      *(undefined8 *)(in_RDI + (long)(local_80 * 2 + 1) * 8) =
           *(undefined8 *)(puVar1 + (long)local_20 * 8);
      *(undefined8 *)(in_RSI + (long)(local_80 << 1) * 8) =
           *(undefined8 *)(puVar2 + (long)local_1c * 8);
      *(undefined8 *)(in_RSI + (long)(local_80 * 2 + 1) * 8) =
           *(undefined8 *)(puVar2 + (long)local_20 * 8);
      local_4c = (int)s2_1 + local_4c;
      local_50 = (int)s1_1 + local_50;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_fetcher(T *buf1, T *buf2, const int len, const QTextureData &image,
                                                         int fx, int fy, const int fdx, const int fdy)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp || (layout.bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;
    if (fdy == 0) {
        int y1 = (fy >> 16);
        int y2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);

        int i = 0;
        if (blendType == BlendTransformedBilinear) {
            for (; i < len; ++i) {
                int x1 = (fx >> 16);
                int x2;
                fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
                if (x1 != x2)
                    break;
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = buf1[i * 2 + 1] = fetch1(s1, x1);
                    buf2[i * 2 + 0] = buf2[i * 2 + 1] = fetch1(s2, x1);
                } else {
                    buf1[i * 2 + 0] = buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x1];
                    buf2[i * 2 + 0] = buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x1];
                }
                fx += fdx;
            }
            int fastLen = len;
            if (fdx > 0)
                fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
            else if (fdx < 0)
                fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

            for (; i < fastLen; ++i) {
                int x = (fx >> 16);
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x);
                    buf1[i * 2 + 1] = fetch1(s1, x + 1);
                    buf2[i * 2 + 0] = fetch1(s2, x);
                    buf2[i * 2 + 1] = fetch1(s2, x + 1);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x + 1];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x + 1];
                }
                fx += fdx;
            }
        }

        for (; i < len; ++i) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if constexpr (useFetch) {
                buf1[i * 2 + 0] = fetch1(s1, x1);
                buf1[i * 2 + 1] = fetch1(s1, x2);
                buf2[i * 2 + 0] = fetch1(s2, x1);
                buf2[i * 2 + 1] = fetch1(s2, x2);
            } else {
                buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
            }
            fx += fdx;
        }
    } else {
        int i = 0;
        if (blendType == BlendTransformedBilinear) {
            for (; i < len; ++i) {
                int x1 = (fx >> 16);
                int x2;
                int y1 = (fy >> 16);
                int y2;
                fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
                fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
                if (x1 != x2 && y1 != y2)
                    break;
                const uchar *s1 = image.scanLine(y1);
                const uchar *s2 = image.scanLine(y2);
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x1);
                    buf1[i * 2 + 1] = fetch1(s1, x2);
                    buf2[i * 2 + 0] = fetch1(s2, x1);
                    buf2[i * 2 + 1] = fetch1(s2, x2);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
                }
                fx += fdx;
                fy += fdy;
            }
            int fastLen = len;
            if (fdx > 0)
                fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
            else if (fdx < 0)
                fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
            if (fdy > 0)
                fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
            else if (fdy < 0)
                fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

            for (; i < fastLen; ++i) {
                int x = (fx >> 16);
                int y = (fy >> 16);
                const uchar *s1 = image.scanLine(y);
                const uchar *s2 = s1 + image.bytesPerLine;
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x);
                    buf1[i * 2 + 1] = fetch1(s1, x + 1);
                    buf2[i * 2 + 0] = fetch1(s2, x);
                    buf2[i * 2 + 1] = fetch1(s2, x + 1);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x + 1];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x + 1];
                }
                fx += fdx;
                fy += fdy;
            }
        }

        for (; i < len; ++i) {
            int x1 = (fx >> 16);
            int x2;
            int y1 = (fy >> 16);
            int y2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uchar *s1 = image.scanLine(y1);
            const uchar *s2 = image.scanLine(y2);
            if constexpr (useFetch) {
                buf1[i * 2 + 0] = fetch1(s1, x1);
                buf1[i * 2 + 1] = fetch1(s1, x2);
                buf2[i * 2 + 0] = fetch1(s2, x1);
                buf2[i * 2 + 1] = fetch1(s2, x2);
            } else {
                buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
            }
            fx += fdx;
            fy += fdy;
        }
    }
}